

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O1

Variant * __thiscall
Jinx::Impl::Script::CallFunction(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  bool bVar1;
  bool bVar2;
  FunctionDefinitionPtr functionDef;
  undefined1 local_50 [32];
  code *local_30;
  
  Runtime::FindFunction
            ((Runtime *)local_50,
             (RuntimeID)
             (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    Error(this,"Could not find function definition");
    __return_storage_ptr__->m_type = Null;
    Variant::SetBoolean(__return_storage_ptr__,false);
  }
  else if (*(_func_int **)(local_50._0_8_ + 0x10) == (_func_int *)0x0) {
    std::
    function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
    ::function((function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
                *)(local_50 + 0x10),
               (function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
                *)(local_50._0_8_ + 0x48));
    if (local_30 == (code *)0x0) {
      Error(this,"Error in function definition");
      __return_storage_ptr__->m_type = Null;
      Variant::SetNull(__return_storage_ptr__);
    }
    else {
      (*local_30)((_Any_data *)(local_50 + 0x10),(_Any_data *)(local_50 + 0x10),__destroy_functor);
      CallNativeFunction(__return_storage_ptr__,this,(FunctionDefinitionPtr *)local_50);
    }
  }
  else {
    CallBytecodeFunction(this,(FunctionDefinitionPtr *)local_50,Wait);
    bVar1 = this->m_finished;
    this->m_finished = false;
    bVar2 = Execute(this);
    if (bVar2) {
      this->m_finished = bVar1;
      Pop(__return_storage_ptr__,this);
    }
    else {
      __return_storage_ptr__->m_type = Null;
      Variant::SetNull(__return_storage_ptr__);
    }
  }
  if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant Script::CallFunction(RuntimeID id)
	{
		FunctionDefinitionPtr functionDef = m_runtime->FindFunction(id);
		if (!functionDef)
		{
			Error("Could not find function definition");
			return false;
		}
		// Check to see if this is a bytecode function
		if (functionDef->GetBytecode())
		{
			CallBytecodeFunction(functionDef, OnReturn::Wait);
			bool finished = m_finished;
			m_finished = false;
			if (!Execute())
				return nullptr;
			m_finished = finished;
			return Pop();
		}
		// Otherwise, call a native function callback
		else if (functionDef->GetCallback())
		{
			return CallNativeFunction(functionDef);
		}
		else
		{
			Error("Error in function definition");
		}
		return nullptr;
	}